

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<DataStream,prevector<28u,unsigned_char,unsigned_int,int>>
               (DataStream *s,prevector<28U,_unsigned_char,_unsigned_int,_int> *args)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = args->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  WriteCompactSize<DataStream>(s,(ulong)uVar3);
  uVar1 = args->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    if (0x1c < uVar1) {
      args = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (args->_union).indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,args,(long)&args->_union + (ulong)uVar3);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}